

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RedirectedStreams::~RedirectedStreams(RedirectedStreams *this)

{
  long *local_38;
  size_type local_30;
  long local_28 [2];
  
  std::__cxx11::stringbuf::str();
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (this->m_redirectedCout,(char *)local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (this->m_redirectedCerr,(char *)local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  RedirectedStream::~RedirectedStream(&(this->m_redirectedStdErr).m_clog);
  RedirectedStream::~RedirectedStream(&(this->m_redirectedStdErr).m_cerr);
  ReusableStringStream::~ReusableStringStream(&(this->m_redirectedStdErr).m_rss);
  RedirectedStream::~RedirectedStream(&(this->m_redirectedStdOut).m_cout);
  ReusableStringStream::~ReusableStringStream(&(this->m_redirectedStdOut).m_rss);
  return;
}

Assistant:

RedirectedStreams::~RedirectedStreams() {
        m_redirectedCout += m_redirectedStdOut.str();
        m_redirectedCerr += m_redirectedStdErr.str();
    }